

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_int_test.cpp
# Opt level: O1

void __thiscall
reflect_value_cast_int_test_int_to_double_cast_Test::TestBody
          (reflect_value_cast_int_test_int_to_double_cast_Test *this)

{
  int iVar1;
  undefined8 uVar2;
  char *message;
  AssertionResult gtest_ar;
  Message local_40;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  uVar2 = value_create_int(0x1e252);
  iVar1 = value_to_int(uVar2);
  uVar2 = value_type_cast(uVar2,6);
  local_40.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(double)iVar1;
  local_38.data_ = (AssertHelperData *)value_to_double(uVar2);
  testing::internal::CmpHelperEQ<double,double>
            (local_30,"(double)i","(double)value_to_double(v)",(double *)&local_40,
             (double *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_28 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_int_test.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_40.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  value_destroy(uVar2);
  return;
}

Assistant:

TEST_F(reflect_value_cast_int_test, int_to_double_cast)
{
	value v = value_create_int(123474);

	int i = value_to_int(v);

	v = value_type_cast(v, TYPE_DOUBLE);

	EXPECT_EQ((double)i, (double)value_to_double(v));

	value_destroy(v);
}